

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Gia_Man_t * Jf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  char *pcVar3;
  bool bVar4;
  Jf_Man_t *p;
  FILE *__stream;
  code *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  Jf_Par_t *pJVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  word *pwVar13;
  char local_418 [1000];
  
  if (pGia->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x6b7,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fGenCnf == 0) goto LAB_007670a2;
  }
  else {
    if ((pPars->fFuncDsd != 0) && (6 < pPars->nLutSize)) {
      __assert_fail("!pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x6b8,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
    }
    if (pPars->fGenCnf == 0) {
      if ((pPars->fCutMin != 0) && (pPars->fFuncDsd == 0)) {
        pPars->fCoarsen = 0;
      }
      goto LAB_007670a2;
    }
  }
  pPars->fCutMin = 1;
  pPars->fFuncDsd = 1;
  pPars->fOptEdge = 0;
LAB_007670a2:
  p = Jf_ManAlloc(pGia,pPars);
  pcVar5 = Jf_CutCompareArea;
  if (pPars->fAreaOnly == 0) {
    pcVar5 = Jf_CutCompareDelay;
  }
  p->pCutCmp = pcVar5;
  iVar11 = 0;
  Jf_ManComputeCuts(p,0);
  Jf_ManComputeRefs(p);
  Jf_ManPrintStats(p,"Start");
  pJVar9 = p->pPars;
  if (0 < pPars->nRounds) {
    do {
      if (pJVar9->fGenCnf == 0) {
        Jf_ManPropagateFlow(p,pPars->fOptEdge);
        Jf_ManPrintStats(p,"Flow ");
      }
      Jf_ManPropagateEla(p,0);
      Jf_ManPrintStats(p,"Area ");
      Jf_ManPropagateEla(p,1);
      Jf_ManPrintStats(p,"Edge ");
      iVar11 = iVar11 + 1;
    } while (iVar11 < pPars->nRounds);
  }
  if (((pJVar9->fVeryVerbose != 0) && (pJVar9->fCutMin != 0)) && (pJVar9->fFuncDsd == 0)) {
    pVVar2 = p->vTtMem;
    pcVar3 = p->pGia->pName;
    uVar1 = pJVar9->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar3);
    __stream = _stdout;
    if ((pcVar3 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar2->nEntries);
    }
    uVar8 = (ulong)(uint)pVVar2->nEntries;
    if ((0 < pVVar2->nEntries) && (pwVar13 = *pVVar2->ppPages, pwVar13 != (word *)0x0)) {
      uVar7 = pVVar2->nEntrySize;
      uVar10 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar8 = (ulong)uVar7;
          do {
            lVar12 = 0x3c;
            do {
              uVar7 = (uint)(pwVar13[uVar8 - 1] >> ((byte)lVar12 & 0x3f)) & 0xf;
              if (uVar7 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar7 + 0x37,__stream);
              }
              lVar12 = lVar12 + -4;
            } while (lVar12 != -4);
            bVar4 = 1 < (long)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar4);
        }
        fputc(10,__stream);
        uVar10 = uVar10 + 1;
        uVar8 = (ulong)(uint)pVVar2->nEntries;
        if (pVVar2->nEntries <= (int)uVar10) break;
        uVar7 = pVVar2->nEntrySize;
        pwVar13 = pVVar2->ppPages[uVar10 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                  (int)((pVVar2->PageMask & uVar10) * uVar7);
      } while (pVVar2->ppPages[uVar10 >> ((byte)pVVar2->LogPageSze & 0x1f)] != (word *)0x0);
    }
    if (__stream != _stdout) {
      fclose(__stream);
      uVar8 = (ulong)(uint)pVVar2->nEntries;
    }
    pcVar6 = local_418;
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar2->nEntrySize * (double)(int)uVar8 * 8.0 * 9.5367431640625e-07,uVar8,
           (ulong)uVar1,pcVar6);
    pJVar9 = p->pPars;
  }
  if (pJVar9->fPureAig == 0) {
    if (pJVar9->fCutMin == 0) {
      Jf_ManDeriveMapping(p);
    }
    else {
      pGia = Jf_ManDeriveMappingGia(p);
    }
  }
  else {
    pGia = Jf_ManDeriveGia(p);
  }
  Jf_ManFree(p);
  return pGia;
}

Assistant:

Gia_Man_t * Jf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = pGia;
    Jf_Man_t * p; int i;
    assert( !Gia_ManBufNum(pGia) );
    assert( !pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6 );
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1, pPars->fFuncDsd = 1, pPars->fOptEdge = 0;
    if ( pPars->fCutMin && !pPars->fFuncDsd )
        pPars->fCoarsen = 0;
    p = Jf_ManAlloc( pGia, pPars );
    p->pCutCmp = pPars->fAreaOnly ? Jf_CutCompareArea : Jf_CutCompareDelay;
    Jf_ManComputeCuts( p, 0 );
    Jf_ManComputeRefs( p );                         Jf_ManPrintStats( p, "Start" );
    for ( i = 0; i < pPars->nRounds; i++ )
    {
        if ( !p->pPars->fGenCnf )
        {
        Jf_ManPropagateFlow( p, pPars->fOptEdge );  Jf_ManPrintStats( p, "Flow " );
        }
        Jf_ManPropagateEla( p, 0 );                 Jf_ManPrintStats( p, "Area " );
        Jf_ManPropagateEla( p, 1 );                 Jf_ManPrintStats( p, "Edge " );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && !p->pPars->fFuncDsd )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), p->pPars->nLutSize );
    if ( p->pPars->fPureAig )
        pNew = Jf_ManDeriveGia(p);
    else if ( p->pPars->fCutMin )
        pNew = Jf_ManDeriveMappingGia(p);
    else
        Jf_ManDeriveMapping(p);
    Jf_ManFree( p );
    return pNew;
}